

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObjectEnumerator.cpp
# Opt level: O0

void __thiscall Js::ES5ArgumentsObjectEnumerator::Reset(ES5ArgumentsObjectEnumerator *this)

{
  ES5ArgumentsObjectEnumerator *this_local;
  
  Init(this,(EnumeratorCache *)0x0);
  return;
}

Assistant:

void ES5ArgumentsObjectEnumerator::Reset()
    {
        Init(nullptr);
    }